

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfInputFile.cpp
# Opt level: O0

void __thiscall
Imf_2_5::InputFile::rawPixelData
          (InputFile *this,int firstScanLine,char **pixelData,int *pixelDataSize)

{
  ArgExc *pAVar1;
  int *in_RDI;
  char **unaff_retaddr;
  int in_stack_0000000c;
  ScanLineInputFile *in_stack_00000010;
  stringstream _iex_replace_s;
  BaseExc *e;
  
  if (*(long *)(*(long *)(in_RDI + 2) + 0x78) != 0) {
    pAVar1 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::ArgExc::ArgExc(pAVar1,"Tried to read a raw scanline from a deep image.");
    __cxa_throw(pAVar1,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
  }
  if ((*(byte *)(*(long *)(in_RDI + 2) + 100) & 1) != 0) {
    pAVar1 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::ArgExc::ArgExc(pAVar1,"Tried to read a raw scanline from a tiled image.");
    __cxa_throw(pAVar1,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
  }
  ScanLineInputFile::rawPixelData(in_stack_00000010,in_stack_0000000c,unaff_retaddr,in_RDI);
  return;
}

Assistant:

void
InputFile::rawPixelData (int firstScanLine,
			 const char *&pixelData,
			 int &pixelDataSize)
{
    try
    {
        if (_data->dsFile)
        {
            throw IEX_NAMESPACE::ArgExc ("Tried to read a raw scanline "
            "from a deep image.");
        }
        
	else if (_data->isTiled)
	{
	    throw IEX_NAMESPACE::ArgExc ("Tried to read a raw scanline "
			       "from a tiled image.");
	}
        
        _data->sFile->rawPixelData (firstScanLine, pixelData, pixelDataSize);
    }
    catch (IEX_NAMESPACE::BaseExc &e)
    {
	REPLACE_EXC (e, "Error reading pixel data from image "
                 "file \"" << fileName() << "\". " << e.what());
	throw;
    }
}